

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-thread.c
# Opt level: O3

int run_test_thread_stack_size_explicit(void)

{
  int *piVar1;
  uv_buf_t *puVar2;
  int iVar3;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  long lVar4;
  addrinfo *ai;
  uv_loop_t *unaff_RBX;
  undefined1 *puVar5;
  uv_fs_t *req;
  int64_t eval_b;
  int64_t eval_a;
  uv_thread_t thread;
  uv_thread_options_t options;
  undefined1 auStack_78 [104];
  Elf64_Ehdr *local_10;
  
  auStack_78._96_4_ = 1;
  local_10 = &Elf64_Ehdr_00100000;
  auStack_78._56_8_ = (void *)0x1cf6f9;
  iVar3 = uv_thread_create_ex((uv_thread_t *)(auStack_78 + 0x58),
                              (uv_thread_options_t *)(auStack_78 + 0x60),thread_check_stack,
                              (uv_thread_options_t *)(auStack_78 + 0x60));
  auStack_78._80_8_ = SEXT48(iVar3);
  auStack_78._72_8_ = 0;
  if ((uv_fs_cb)auStack_78._80_8_ == (uv_fs_cb)0x0) {
    auStack_78._56_8_ = (void *)0x1cf723;
    iVar3 = uv_thread_join((uv_thread_t *)(auStack_78 + 0x58));
    auStack_78._80_8_ = SEXT48(iVar3);
    auStack_78._72_8_ = 0;
    if ((uv_fs_cb)auStack_78._80_8_ != (uv_fs_cb)0x0) goto LAB_001cf9f7;
    local_10 = (Elf64_Ehdr *)(data + 0x4441a0);
    auStack_78._56_8_ = (void *)0x1cf764;
    iVar3 = uv_thread_create_ex((uv_thread_t *)(auStack_78 + 0x58),
                                (uv_thread_options_t *)(auStack_78 + 0x60),thread_check_stack,
                                (uv_thread_options_t *)(auStack_78 + 0x60));
    auStack_78._80_8_ = SEXT48(iVar3);
    auStack_78._72_8_ = 0;
    if ((uv_fs_cb)auStack_78._80_8_ != (uv_fs_cb)0x0) goto LAB_001cfa06;
    auStack_78._56_8_ = (void *)0x1cf78e;
    iVar3 = uv_thread_join((uv_thread_t *)(auStack_78 + 0x58));
    auStack_78._80_8_ = SEXT48(iVar3);
    auStack_78._72_8_ = 0;
    if ((uv_fs_cb)auStack_78._80_8_ != (uv_fs_cb)0x0) goto LAB_001cfa15;
    unaff_RBX = (uv_loop_t *)0x0;
    local_10 = (Elf64_Ehdr *)0x0;
    auStack_78._56_8_ = (void *)0x1cf7cd;
    iVar3 = uv_thread_create_ex((uv_thread_t *)(auStack_78 + 0x58),
                                (uv_thread_options_t *)(auStack_78 + 0x60),thread_check_stack,
                                (uv_thread_options_t *)(auStack_78 + 0x60));
    auStack_78._80_8_ = SEXT48(iVar3);
    auStack_78._72_8_ = 0;
    if ((uv_fs_cb)auStack_78._80_8_ != (uv_fs_cb)0x0) goto LAB_001cfa24;
    auStack_78._56_8_ = (void *)0x1cf7f3;
    iVar3 = uv_thread_join((uv_thread_t *)(auStack_78 + 0x58));
    auStack_78._80_8_ = SEXT48(iVar3);
    auStack_78._72_8_ = 0;
    if ((uv_fs_cb)auStack_78._80_8_ != (uv_fs_cb)0x0) goto LAB_001cfa33;
    local_10 = (Elf64_Ehdr *)0x2a;
    auStack_78._56_8_ = (void *)0x1cf834;
    iVar3 = uv_thread_create_ex((uv_thread_t *)(auStack_78 + 0x58),
                                (uv_thread_options_t *)(auStack_78 + 0x60),thread_check_stack,
                                (uv_thread_options_t *)(auStack_78 + 0x60));
    auStack_78._80_8_ = SEXT48(iVar3);
    auStack_78._72_8_ = 0;
    if ((uv_fs_cb)auStack_78._80_8_ != (uv_fs_cb)0x0) goto LAB_001cfa42;
    auStack_78._56_8_ = (void *)0x1cf85e;
    iVar3 = uv_thread_join((uv_thread_t *)(auStack_78 + 0x58));
    auStack_78._80_8_ = SEXT48(iVar3);
    auStack_78._72_8_ = 0;
    if ((uv_fs_cb)auStack_78._80_8_ != (uv_fs_cb)0x0) goto LAB_001cfa51;
    auStack_78._56_8_ = (void *)0x1cf888;
    lVar4 = __sysconf(0x4b);
    local_10 = (Elf64_Ehdr *)(lVar4 + -0x2a);
    auStack_78._56_8_ = (void *)0x1cf8a9;
    iVar3 = uv_thread_create_ex((uv_thread_t *)(auStack_78 + 0x58),
                                (uv_thread_options_t *)(auStack_78 + 0x60),thread_check_stack,
                                (uv_thread_options_t *)(auStack_78 + 0x60));
    auStack_78._80_8_ = SEXT48(iVar3);
    auStack_78._72_8_ = 0;
    if ((uv_fs_cb)auStack_78._80_8_ != (uv_fs_cb)0x0) goto LAB_001cfa60;
    auStack_78._56_8_ = (void *)0x1cf8d3;
    iVar3 = uv_thread_join((uv_thread_t *)(auStack_78 + 0x58));
    auStack_78._80_8_ = SEXT48(iVar3);
    auStack_78._72_8_ = 0;
    if ((uv_fs_cb)auStack_78._80_8_ != (uv_fs_cb)0x0) goto LAB_001cfa6f;
    auStack_78._56_8_ = (void *)0x1cf8fd;
    lVar4 = __sysconf(0x4b);
    local_10 = (Elf64_Ehdr *)(lVar4 / 2 + -0x2a);
    auStack_78._56_8_ = (void *)0x1cf92b;
    iVar3 = uv_thread_create_ex((uv_thread_t *)(auStack_78 + 0x58),
                                (uv_thread_options_t *)(auStack_78 + 0x60),thread_check_stack,
                                (uv_thread_options_t *)(auStack_78 + 0x60));
    auStack_78._80_8_ = SEXT48(iVar3);
    auStack_78._72_8_ = 0;
    if ((uv_fs_cb)auStack_78._80_8_ != (uv_fs_cb)0x0) goto LAB_001cfa7e;
    auStack_78._56_8_ = (void *)0x1cf955;
    iVar3 = uv_thread_join((uv_thread_t *)(auStack_78 + 0x58));
    auStack_78._80_8_ = SEXT48(iVar3);
    auStack_78._72_8_ = 0;
    if ((uv_fs_cb)auStack_78._80_8_ != (uv_fs_cb)0x0) goto LAB_001cfa8d;
    local_10 = (Elf64_Ehdr *)0x12d687;
    auStack_78._56_8_ = (void *)0x1cf996;
    iVar3 = uv_thread_create_ex((uv_thread_t *)(auStack_78 + 0x58),
                                (uv_thread_options_t *)(auStack_78 + 0x60),thread_check_stack,
                                (uv_thread_options_t *)(auStack_78 + 0x60));
    auStack_78._80_8_ = SEXT48(iVar3);
    auStack_78._72_8_ = 0;
    if ((uv_fs_cb)auStack_78._80_8_ == (uv_fs_cb)0x0) {
      auStack_78._56_8_ = (void *)0x1cf9c0;
      iVar3 = uv_thread_join((uv_thread_t *)(auStack_78 + 0x58));
      auStack_78._80_8_ = SEXT48(iVar3);
      auStack_78._72_8_ = 0;
      if ((uv_fs_cb)auStack_78._80_8_ == (uv_fs_cb)0x0) {
        return 0;
      }
      goto LAB_001cfaab;
    }
  }
  else {
    auStack_78._56_8_ = (void *)0x1cf9f7;
    run_test_thread_stack_size_explicit_cold_1();
LAB_001cf9f7:
    auStack_78._56_8_ = (void *)0x1cfa06;
    run_test_thread_stack_size_explicit_cold_2();
LAB_001cfa06:
    auStack_78._56_8_ = (void *)0x1cfa15;
    run_test_thread_stack_size_explicit_cold_3();
LAB_001cfa15:
    auStack_78._56_8_ = (void *)0x1cfa24;
    run_test_thread_stack_size_explicit_cold_4();
LAB_001cfa24:
    auStack_78._56_8_ = (void *)0x1cfa33;
    run_test_thread_stack_size_explicit_cold_5();
LAB_001cfa33:
    auStack_78._56_8_ = (void *)0x1cfa42;
    run_test_thread_stack_size_explicit_cold_6();
LAB_001cfa42:
    auStack_78._56_8_ = (void *)0x1cfa51;
    run_test_thread_stack_size_explicit_cold_7();
LAB_001cfa51:
    auStack_78._56_8_ = (void *)0x1cfa60;
    run_test_thread_stack_size_explicit_cold_8();
LAB_001cfa60:
    auStack_78._56_8_ = (void *)0x1cfa6f;
    run_test_thread_stack_size_explicit_cold_9();
LAB_001cfa6f:
    auStack_78._56_8_ = (void *)0x1cfa7e;
    run_test_thread_stack_size_explicit_cold_10();
LAB_001cfa7e:
    auStack_78._56_8_ = (void *)0x1cfa8d;
    run_test_thread_stack_size_explicit_cold_11();
LAB_001cfa8d:
    auStack_78._56_8_ = (void *)0x1cfa9c;
    run_test_thread_stack_size_explicit_cold_12();
  }
  auStack_78._56_8_ = (void *)0x1cfaab;
  run_test_thread_stack_size_explicit_cold_13();
LAB_001cfaab:
  puVar5 = auStack_78 + 0x50;
  auStack_78._56_8_ = getaddrinfo_do;
  run_test_thread_stack_size_explicit_cold_14();
  auStack_78._32_8_ = (void *)0x1cfae2;
  iVar3 = uv_getaddrinfo(*(uv_loop_t **)(puVar5 + 0x10),(uv_getaddrinfo_t *)(puVar5 + 0x18),
                         getaddrinfo_cb,"localhost",(char *)0x0,(addrinfo *)0x0);
  auStack_78._56_8_ = SEXT48(iVar3);
  auStack_78._48_8_ = (void *)0x0;
  if ((void *)auStack_78._56_8_ == (void *)0x0) {
    return iVar3;
  }
  puVar5 = auStack_78 + 0x38;
  auStack_78._32_8_ = fs_do;
  getaddrinfo_do_cold_1();
  auStack_78._8_8_ = (uv_loop_t *)0x1cfb34;
  iVar3 = uv_fs_stat(*(uv_loop_t **)(puVar5 + 0x10),(uv_fs_t *)(puVar5 + 0x18),".",fs_cb);
  auStack_78._32_8_ = SEXT48(iVar3);
  auStack_78._24_8_ = (void *)0x0;
  if ((void *)auStack_78._32_8_ == (void *)0x0) {
    return iVar3;
  }
  puVar5 = auStack_78 + 0x20;
  iVar3 = (int)auStack_78 + 0x18;
  auStack_78._8_8_ = getaddrinfo_cb;
  fs_do_cold_1();
  auStack_78._0_8_ = SEXT48(iVar3);
  auStack_78._8_8_ = unaff_RBX;
  if ((void *)auStack_78._0_8_ != (void *)0x0) {
    req = (uv_fs_t *)auStack_78;
    getaddrinfo_cb_cold_1();
    uv_fs_req_cleanup(req);
    puVar2 = req[-1].bufsml + 3;
    *(int *)&puVar2->base = *(int *)&puVar2->base + -1;
    if (*(int *)&puVar2->base != 0) {
      fs_do((fs_req *)&req[-1].bufsml[2].len);
      return extraout_EAX_02;
    }
    return extraout_EAX_01;
  }
  uv_freeaddrinfo(ai);
  piVar1 = (int *)(puVar5 + -0x10);
  *piVar1 = *piVar1 + -1;
  if (*piVar1 != 0) {
    getaddrinfo_do((getaddrinfo_req *)(puVar5 + -0x18));
    return extraout_EAX_00;
  }
  return extraout_EAX;
}

Assistant:

TEST_IMPL(thread_stack_size_explicit) {
  uv_thread_t thread;
  uv_thread_options_t options;

  options.flags = UV_THREAD_HAS_STACK_SIZE;
  options.stack_size = 1024 * 1024;
  ASSERT_OK(uv_thread_create_ex(&thread, &options,
                                thread_check_stack, &options));
  ASSERT_OK(uv_thread_join(&thread));

  options.stack_size = 8 * 1024 * 1024;  /* larger than most default os sizes */
  ASSERT_OK(uv_thread_create_ex(&thread, &options,
                                thread_check_stack, &options));
  ASSERT_OK(uv_thread_join(&thread));

  options.stack_size = 0;
  ASSERT_OK(uv_thread_create_ex(&thread, &options,
                                thread_check_stack, &options));
  ASSERT_OK(uv_thread_join(&thread));

  options.stack_size = 42;
  ASSERT_OK(uv_thread_create_ex(&thread, &options,
                                thread_check_stack, &options));
  ASSERT_OK(uv_thread_join(&thread));

#ifdef PTHREAD_STACK_MIN
  options.stack_size = PTHREAD_STACK_MIN - 42;  /* unaligned size */
  ASSERT_OK(uv_thread_create_ex(&thread, &options,
                                thread_check_stack, &options));
  ASSERT_OK(uv_thread_join(&thread));

  options.stack_size = PTHREAD_STACK_MIN / 2 - 42;  /* unaligned size */
  ASSERT_OK(uv_thread_create_ex(&thread, &options,
                                thread_check_stack, &options));
  ASSERT_OK(uv_thread_join(&thread));
#endif

  /* unaligned size, should be larger than PTHREAD_STACK_MIN */
  options.stack_size = 1234567;
  ASSERT_OK(uv_thread_create_ex(&thread, &options,
                                thread_check_stack, &options));
  ASSERT_OK(uv_thread_join(&thread));

  return 0;
}